

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

void __thiscall
t_netstd_generator::generate_netstd_struct_writer
          (t_netstd_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  t_field *tfield;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  pointer pptVar4;
  t_netstd_generator *this_00;
  string tmpvar;
  string name;
  string local_178;
  t_struct *local_158;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_158 = tstruct;
  t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_110);
  poVar3 = std::operator<<(poVar3,
                           "public async global::System.Threading.Tasks.Task WriteAsync(TProtocol oprot, CancellationToken "
                          );
  poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,")");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_150);
  poVar3 = std::operator<<(poVar3,"{");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_110);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_110);
  poVar3 = std::operator<<(poVar3,"oprot.IncrementRecursionDepth();");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_150);
  poVar3 = std::operator<<(poVar3,"try");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_178,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_178);
  poVar3 = std::operator<<(poVar3,"{");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_110);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  iVar2 = (*(local_158->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::__cxx11::string::string((string *)&local_110,(string *)CONCAT44(extraout_var,iVar2));
  std::__cxx11::string::string((string *)&local_b0,"tmp",(allocator *)&local_178);
  t_generator::tmp(&local_150,(t_generator *)this,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  t_generator::indent_abi_cxx11_(&local_178,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_178);
  poVar3 = std::operator<<(poVar3,"var ");
  poVar3 = std::operator<<(poVar3,(string *)&local_150);
  poVar3 = std::operator<<(poVar3," = new TStruct(\"");
  poVar3 = std::operator<<(poVar3,(string *)&local_110);
  poVar3 = std::operator<<(poVar3,"\");");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_130);
  poVar3 = std::operator<<(poVar3,"await oprot.WriteStructBeginAsync(");
  poVar3 = std::operator<<(poVar3,(string *)&local_150);
  poVar3 = std::operator<<(poVar3,", ");
  poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,");");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_178);
  if ((local_158->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (local_158->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    std::__cxx11::string::string((string *)&local_d0,"tmp",(allocator *)&local_130);
    t_generator::tmp(&local_178,(t_generator *)this,&local_d0);
    std::__cxx11::string::operator=((string *)&local_150,(string *)&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_d0);
    t_generator::indent_abi_cxx11_(&local_178,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_178);
    poVar3 = std::operator<<(poVar3,"var ");
    poVar3 = std::operator<<(poVar3,(string *)&local_150);
    poVar3 = std::operator<<(poVar3," = new TField();");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_178);
    for (pptVar4 = (local_158->members_in_id_order_).
                   super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pptVar4 !=
        (local_158->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
      generate_null_check_begin(this,out,*pptVar4);
      t_generator::indent_abi_cxx11_(&local_178,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&local_178);
      poVar3 = std::operator<<(poVar3,(string *)&local_150);
      poVar3 = std::operator<<(poVar3,".Name = \"");
      poVar3 = std::operator<<(poVar3,(string *)&(*pptVar4)->name_);
      poVar3 = std::operator<<(poVar3,"\";");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
      poVar3 = std::operator<<(poVar3,(string *)&local_130);
      poVar3 = std::operator<<(poVar3,(string *)&local_150);
      this_00 = (t_netstd_generator *)0x2f1577;
      poVar3 = std::operator<<(poVar3,".Type = ");
      type_to_enum_abi_cxx11_(&local_f0,this_00,(*pptVar4)->type_);
      poVar3 = std::operator<<(poVar3,(string *)&local_f0);
      poVar3 = std::operator<<(poVar3,";");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
      poVar3 = std::operator<<(poVar3,(string *)&local_70);
      poVar3 = std::operator<<(poVar3,(string *)&local_150);
      poVar3 = std::operator<<(poVar3,".ID = ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(*pptVar4)->key_);
      poVar3 = std::operator<<(poVar3,";");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
      poVar3 = std::operator<<(poVar3,(string *)&local_90);
      poVar3 = std::operator<<(poVar3,"await oprot.WriteFieldBeginAsync(");
      poVar3 = std::operator<<(poVar3,(string *)&local_150);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,");");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_178);
      tfield = *pptVar4;
      std::__cxx11::string::string((string *)&local_50,"",(allocator *)&local_178);
      generate_serialize_field(this,out,tfield,&local_50,false);
      std::__cxx11::string::~string((string *)&local_50);
      t_generator::indent_abi_cxx11_(&local_178,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&local_178);
      poVar3 = std::operator<<(poVar3,"await oprot.WriteFieldEndAsync(");
      poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,");");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_178);
      generate_null_check_end(this,out,*pptVar4);
    }
  }
  t_generator::indent_abi_cxx11_(&local_178,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_178);
  poVar3 = std::operator<<(poVar3,"await oprot.WriteFieldStopAsync(");
  poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,");");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_130);
  poVar3 = std::operator<<(poVar3,"await oprot.WriteStructEndAsync(");
  poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,");");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_178);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_178,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_178);
  poVar3 = std::operator<<(poVar3,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_130);
  poVar3 = std::operator<<(poVar3,"finally");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_f0);
  poVar3 = std::operator<<(poVar3,"{");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_178);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_178,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_178);
  poVar3 = std::operator<<(poVar3,"oprot.DecrementRecursionDepth();");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_178);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_178,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_178);
  poVar3 = std::operator<<(poVar3,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_178);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_178,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_178);
  poVar3 = std::operator<<(poVar3,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_110);
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_struct_writer(ostream& out, t_struct* tstruct)
{
    out << indent() << "public async global::System.Threading.Tasks.Task WriteAsync(TProtocol oprot, CancellationToken " << CANCELLATION_TOKEN_NAME << ")" << endl
        << indent() << "{" << endl;
    indent_up();

    out << indent() << "oprot.IncrementRecursionDepth();" << endl
        << indent() << "try" << endl
        << indent() << "{" << endl;
    indent_up();

    string name = tstruct->get_name();
    const vector<t_field*>& fields = tstruct->get_sorted_members();
    vector<t_field*>::const_iterator f_iter;

    string tmpvar = tmp("tmp");
    out << indent() << "var " << tmpvar << " = new TStruct(\"" << name << "\");" << endl
        << indent() << "await oprot.WriteStructBeginAsync(" << tmpvar << ", " << CANCELLATION_TOKEN_NAME << ");" << endl;

    if (fields.size() > 0)
    {
        tmpvar = tmp("tmp");
        out << indent() << "var " << tmpvar << " = new TField();" << endl;
        for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
        {
            generate_null_check_begin( out, *f_iter);
            out << indent() << tmpvar << ".Name = \"" << (*f_iter)->get_name() << "\";" << endl
                << indent() << tmpvar << ".Type = " << type_to_enum((*f_iter)->get_type()) << ";" << endl
                << indent() << tmpvar << ".ID = " << (*f_iter)->get_key() << ";" << endl
                << indent() << "await oprot.WriteFieldBeginAsync(" << tmpvar << ", " << CANCELLATION_TOKEN_NAME << ");" << endl;

            generate_serialize_field(out, *f_iter);

            out << indent() << "await oprot.WriteFieldEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
            generate_null_check_end(out, *f_iter);
        }
    }

    out << indent() << "await oprot.WriteFieldStopAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl
        << indent() << "await oprot.WriteStructEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    indent_down();
    out << indent() << "}" << endl
        << indent() << "finally" << endl
        << indent() << "{" << endl;
    indent_up();
    out << indent() << "oprot.DecrementRecursionDepth();" << endl;
    indent_down();
    out << indent() << "}" << endl;
    indent_down();
    out << indent() << "}" << endl << endl;
}